

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::MaterialBinding::get_materialBinding
          (MaterialBinding *this,token *mat_purpose,Relationship *relOut)

{
  int iVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  bool *pbVar4;
  
  if (relOut == (Relationship *)0x0) {
    return false;
  }
  if ((mat_purpose->str_)._M_string_length == 0) {
    if ((this->materialBinding).has_value_ != true) {
      return false;
    }
    relOut->type = *(Type *)&(this->materialBinding).contained;
    Path::operator=(&relOut->targetPath,(Path *)((long)&(this->materialBinding).contained + 8));
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&relOut->targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               ((long)&(this->materialBinding).contained + 0xd8));
    relOut->listOpQual = *(ListEditQual *)((long)&(this->materialBinding).contained + 0xf0);
    AttrMetas::operator=
              (&relOut->_metas,(AttrMetas *)((long)&(this->materialBinding).contained + 0xf8));
    pbVar4 = (bool *)((long)&(this->materialBinding).contained + 0x300);
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)mat_purpose);
    if (iVar1 == 0) {
      if ((this->materialBindingFull).has_value_ != true) {
        return false;
      }
      relOut->type = *(Type *)&(this->materialBindingFull).contained;
      Path::operator=(&relOut->targetPath,(Path *)((long)&(this->materialBindingFull).contained + 8)
                     );
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&relOut->targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 ((long)&(this->materialBindingFull).contained + 0xd8));
      relOut->listOpQual = *(ListEditQual *)((long)&(this->materialBindingFull).contained + 0xf0);
      AttrMetas::operator=
                (&relOut->_metas,(AttrMetas *)((long)&(this->materialBindingFull).contained + 0xf8))
      ;
      pbVar4 = (bool *)((long)&(this->materialBindingFull).contained + 0x300);
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)mat_purpose);
      if (iVar1 == 0) {
        if ((this->materialBindingPreview).has_value_ != true) {
          return false;
        }
        relOut->type = *(Type *)&(this->materialBindingPreview).contained;
        Path::operator=(&relOut->targetPath,
                        (Path *)((long)&(this->materialBindingPreview).contained + 8));
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&relOut->targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   ((long)&(this->materialBindingPreview).contained + 0xd8));
        relOut->listOpQual =
             *(ListEditQual *)((long)&(this->materialBindingPreview).contained + 0xf0);
        AttrMetas::operator=
                  (&relOut->_metas,
                   (AttrMetas *)((long)&(this->materialBindingPreview).contained + 0xf8));
        pbVar4 = (bool *)((long)&(this->materialBindingPreview).contained + 0x300);
      }
      else {
        cVar2 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                ::find(&(this->_materialBindingMap)._M_t,&mat_purpose->str_);
        if ((_Rb_tree_header *)cVar2._M_node ==
            &(this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header) {
          return false;
        }
        pmVar3 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                 ::at(&this->_materialBindingMap,&mat_purpose->str_);
        relOut->type = pmVar3->type;
        Path::operator=(&relOut->targetPath,&pmVar3->targetPath);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&relOut->targetPathVector,&pmVar3->targetPathVector);
        relOut->listOpQual = pmVar3->listOpQual;
        AttrMetas::operator=(&relOut->_metas,&pmVar3->_metas);
        pbVar4 = &pmVar3->_varying_authored;
      }
    }
  }
  relOut->_varying_authored = *pbVar4;
  return true;
}

Assistant:

bool get_materialBinding(const value::token &mat_purpose, Relationship *relOut) const {
    if (!relOut) {
      return false;
    }

    if (mat_purpose.str().empty()) {
      if (materialBinding.has_value()) {
        (*relOut) = materialBinding.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "full") {
      if (materialBindingFull.has_value()) {
        (*relOut) = materialBindingFull.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "preview") {
      if (materialBindingPreview.has_value()) {
        (*relOut) = materialBindingPreview.value();
        return true;
      } else {
        return false; // not authored
      }
    } else {
      if (_materialBindingMap.count(mat_purpose.str())) {
        (*relOut) = _materialBindingMap.at(mat_purpose.str());
        return true;
      } else {
        return false; // not authored
      }
    }
  }